

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManCutPrint(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Vec_Ptr_t *vMinCut;
  Vec_Ptr_t *vMinCut_00;
  int And;
  int Ffs;
  int Pis;
  Vec_Ptr_t *vRange;
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  uVar1 = Llb_ManCutPiNum(p,vLower);
  uVar2 = Llb_ManCutLoNum(p,vLower);
  iVar3 = Vec_PtrSize(vLower);
  uVar4 = Vec_PtrSize(vLower);
  printf("Leaf: %3d=%3d+%3d+%3d  ",(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,
         (ulong)((iVar3 - uVar1) - uVar2));
  uVar1 = Llb_ManCutPiNum(p,vUpper);
  uVar2 = Llb_ManCutLiNum(p,vUpper);
  iVar3 = Vec_PtrSize(vUpper);
  uVar4 = Vec_PtrSize(vUpper);
  printf("Root: %3d=%3d+%3d+%3d  ",(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,
         (ulong)((iVar3 - uVar1) - uVar2));
  vMinCut = Llb_ManCutSupp(p,vLower,vUpper);
  uVar1 = Llb_ManCutPiNum(p,vMinCut);
  uVar2 = Llb_ManCutLoNum(p,vMinCut);
  iVar3 = Vec_PtrSize(vMinCut);
  uVar4 = Vec_PtrSize(vMinCut);
  printf("Supp: %3d=%3d+%3d+%3d  ",(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,
         (ulong)((iVar3 - uVar1) - uVar2));
  vMinCut_00 = Llb_ManCutRange(p,vLower,vUpper);
  uVar1 = Llb_ManCutPiNum(p,vMinCut_00);
  uVar2 = Llb_ManCutLiNum(p,vMinCut_00);
  iVar3 = Vec_PtrSize(vMinCut_00);
  uVar4 = Vec_PtrSize(vMinCut_00);
  printf("Range: %3d=%3d+%3d+%3d  ",(ulong)uVar4,(ulong)uVar1,(ulong)uVar2,
         (ulong)((iVar3 - uVar1) - uVar2));
  iVar3 = Vec_PtrSize(vMinCut);
  iVar5 = Vec_PtrSize(vMinCut_00);
  uVar1 = Llb_ManCutVolume(p,vLower,vUpper);
  printf("S =%3d. V =%3d.\n",(ulong)(uint)(iVar3 + iVar5),(ulong)uVar1);
  Vec_PtrFree(vMinCut);
  Vec_PtrFree(vMinCut_00);
  return;
}

Assistant:

void Llb_ManCutPrint( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vSupp, * vRange;
    int Pis, Ffs, And;

    Pis = Llb_ManCutPiNum(p, vLower);
    Ffs = Llb_ManCutLoNum(p, vLower);
    And = Vec_PtrSize(vLower) - Pis - Ffs;
    printf( "Leaf: %3d=%3d+%3d+%3d  ",  Vec_PtrSize(vLower), Pis, Ffs, And );

    Pis = Llb_ManCutPiNum(p, vUpper);
    Ffs = Llb_ManCutLiNum(p, vUpper);
    And = Vec_PtrSize(vUpper) - Pis - Ffs;
    printf( "Root: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vUpper), Pis, Ffs, And );

    vSupp = Llb_ManCutSupp( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vSupp);
    Ffs = Llb_ManCutLoNum(p, vSupp);
    And = Vec_PtrSize(vSupp) - Pis - Ffs;
    printf( "Supp: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vSupp), Pis, Ffs, And );

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    Pis = Llb_ManCutPiNum(p, vRange);
    Ffs = Llb_ManCutLiNum(p, vRange);
    And = Vec_PtrSize(vRange) - Pis - Ffs;
    printf( "Range: %3d=%3d+%3d+%3d  ", Vec_PtrSize(vRange), Pis, Ffs, And );

    printf( "S =%3d. V =%3d.\n", 
        Vec_PtrSize(vSupp)+Vec_PtrSize(vRange), Llb_ManCutVolume(p, vLower, vUpper) );
    Vec_PtrFree( vSupp );
    Vec_PtrFree( vRange );
/*   
    {
        Aig_Obj_t * pObj;
        int i;
        printf( "Lower: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
            printf( " %d", pObj->Id );
        printf( "     " );
        printf( "Upper: " );
        Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
            printf( " %d", pObj->Id );
        printf( "\n" );
    }
*/
}